

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::anon_unknown_0::AbsCaseInstance::getInputValues
          (AbsCaseInstance *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  DataType dataType;
  pointer pSVar3;
  void *pvVar4;
  deUint32 dVar5;
  int iVar6;
  int in_R9D;
  ulong uVar7;
  float fVar8;
  Random rnd;
  IVec2 intRanges [3];
  Vec2 floatRanges [3];
  deRandom local_78;
  int local_68 [8];
  float local_48 [8];
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -1000.0;
  local_48[3] = 1000.0;
  local_48[4] = -1e+07;
  local_48[5] = 1e+07;
  local_68[0] = -0x7f;
  local_68[1] = 0x7f;
  local_68[2] = -0x7fff;
  local_68[3] = 0x7fff;
  local_68[4] = -0x7fffffff;
  local_68[5] = 0x7fffffff;
  dVar5 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_78,dVar5 ^ 0x235fac);
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar3->varType).m_data.basic.type;
  uVar7 = (ulong)*(uint *)((long)&(pSVar3->varType).m_data + 4);
  iVar6 = glu::getDataTypeScalarSize(dataType);
  if (dataType - TYPE_FLOAT < 4) {
    if (0 < iVar6 * numValues) {
      fVar1 = local_48[uVar7 * 2];
      pvVar4 = *values;
      fVar2 = local_48[uVar7 * 2 + 1];
      uVar7 = 0;
      do {
        fVar8 = deRandom_getFloat(&local_78);
        *(float *)((long)pvVar4 + uVar7 * 4) = fVar8 * (fVar2 - fVar1) + fVar1;
        uVar7 = uVar7 + 1;
      } while ((uint)(iVar6 * numValues) != uVar7);
    }
  }
  else {
    fillRandomScalars<int>
              ((Random *)&local_78,local_68[uVar7 * 2],local_68[uVar7 * 2 + 1],*values,
               iVar6 * numValues,in_R9D);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7)+1,	(1<<7)-1),
			IVec2(-(1<<15)+1,	(1<<15)-1),
			IVec2(0x80000001,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(m_name) ^ 0x235facu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), values[0], numValues*scalarSize);
		else
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), values[0], numValues*scalarSize);
	}